

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  time_t tVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  Instance *instance;
  GeneticAlgorithm geneticAlgorithm;
  LoadingInstance loadInstance;
  Result result;
  ifstream m50n1000;
  shared_ptr<Instance> local_290;
  GeneticAlgorithm local_280;
  LoadingInstance local_260;
  Result local_258;
  istream local_228 [520];
  
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  local_260.in = (istream *)&std::cin;
  local_280.super_AbstractAlgorithm._vptr_AbstractAlgorithm =
       (_func_int **)&PTR__GeneticAlgorithm_0010abc8;
  local_280.population.
  super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_280.population.
  super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_280.destinatedPopulationSize = 100;
  std::ifstream::ifstream(local_228,"Instances/m50",_S_in);
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010ad60;
  instance = (Instance *)(this + 1);
  this[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[1]._M_use_count = 0;
  this[1]._M_weak_count = 0;
  *(undefined8 *)&this[1]._M_weak_count = 0;
  *(undefined8 *)((long)&this[2]._vptr__Sp_counted_base + 4) = 0;
  local_260.in = local_228;
  LoadingInstance::Build(&local_260,instance);
  operator<<((ostream *)&std::cout,instance);
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = this->_M_use_count + 1;
  }
  local_290.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = instance;
  local_290.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this;
  GeneticAlgorithm::operator()(&local_258,&local_280,&local_290);
  if (local_290.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_290.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  Result::showyourself(&local_258);
  if (local_258.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<Core,_std::allocator<Core>_>::~vector(&local_258.Cores);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  std::ifstream::~ifstream(local_228);
  local_280.super_AbstractAlgorithm._vptr_AbstractAlgorithm =
       (_func_int **)&PTR__GeneticAlgorithm_0010abc8;
  if (local_280.population.
      super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.population.
               super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return 0;
}

Assistant:

int main(){
	//Seed for srand
	srand( time (NULL) );
	//Create needed objects
    LoadingInstance loadInstance;

	GeneticAlgorithm geneticAlgorithm;

	std::ifstream m50n1000("Instances/m50");

	auto instance = std::make_shared<Instance>( Instance() );

	//Load data
	loadInstance.SetSource(m50n1000);
	loadInstance.Build(*instance);
   	std::cout << *instance;

	auto result = geneticAlgorithm(instance);
	result.showyourself();

    return 0;
}